

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void __thiscall
JSON::JSON(JSON *this,unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *value)

{
  Members *this_00;
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> local_20;
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *local_18;
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *value_local;
  JSON *this_local;
  
  local_18 = value;
  value_local = (unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> *)this;
  this_00 = (Members *)operator_new(0x18);
  std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::unique_ptr
            (&local_20,value);
  Members::Members(this_00,&local_20);
  std::shared_ptr<JSON::Members>::shared_ptr<JSON::Members,void>(&this->m,this_00);
  std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

JSON::JSON(std::unique_ptr<JSON_value> value) :
    m(new Members(std::move(value)))
{
}